

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void polyscope::view::buildViewGui(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  float *pfVar7;
  float fVar8;
  double dVar9;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar10;
  undefined8 uVar11;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar12;
  vec3 vVar13;
  bool changed_1;
  bool sizeLocked;
  int currHeight;
  int currWidth;
  bool changed;
  string projectionModeStr;
  float farClipRatioF;
  float nearClipRatioF;
  float fovF;
  vec3 *bboxMax;
  vec3 *bboxMin;
  float moveScaleF;
  vec3 frontDir;
  vec3 upDir;
  string frontStyleName;
  string upStyleName;
  NavigateStyle s;
  iterator __end4;
  iterator __begin4;
  array<polyscope::NavigateStyle,_5UL> *__range4;
  array<polyscope::NavigateStyle,_5UL> styles;
  string viewStyleName;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffd48;
  float in_stack_fffffffffffffd50;
  undefined2 in_stack_fffffffffffffd54;
  undefined1 in_stack_fffffffffffffd56;
  undefined1 in_stack_fffffffffffffd57;
  char *in_stack_fffffffffffffd58;
  char *in_stack_fffffffffffffd60;
  float item_width;
  undefined4 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6c;
  undefined1 in_stack_fffffffffffffd6d;
  undefined1 in_stack_fffffffffffffd6e;
  undefined1 in_stack_fffffffffffffd6f;
  undefined1 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd71;
  undefined1 in_stack_fffffffffffffd72;
  undefined1 in_stack_fffffffffffffd73;
  undefined1 in_stack_fffffffffffffd74;
  undefined1 in_stack_fffffffffffffd75;
  undefined1 in_stack_fffffffffffffd76;
  undefined1 in_stack_fffffffffffffd77;
  undefined8 in_stack_fffffffffffffd78;
  ImGuiInputTextFlags flags;
  int in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd84;
  float *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  NavigateStyle in_stack_fffffffffffffdac;
  int local_1dc;
  int in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  ImGuiSelectableFlags in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  byte bVar14;
  ImVec2 in_stack_fffffffffffffe38;
  ImVec2 local_1c0;
  string local_1b8 [36];
  float local_194;
  float local_190;
  float local_18c;
  undefined1 *local_188;
  bool *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  ImGuiComboFlags in_stack_fffffffffffffe9c;
  char *in_stack_fffffffffffffea0;
  char *preview_value;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  string local_100 [32];
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  string local_b0 [32];
  ImVec2 local_90;
  string local_88 [36];
  value_type local_64;
  iterator local_60;
  iterator local_58;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  string local_20 [32];
  
  ImGui::SetNextTreeNodeOpen(false,0x3dfcd3);
  if ((openSlicePlaneMenu & 1) != 0) {
    ImGui::SetNextTreeNodeOpen(false,0x3dfceb);
  }
  bVar3 = ImGui::TreeNode((char *)in_stack_fffffffffffffd48);
  if (bVar3) {
    to_string_abi_cxx11_(in_stack_fffffffffffffdac);
    ImGui::PushItemWidth((float)((ulong)in_stack_fffffffffffffd60 >> 0x20));
    local_48 = 0x100000000;
    uStack_40 = 0x400000002;
    local_38 = 5;
    std::__cxx11::string::c_str();
    bVar3 = ImGui::BeginCombo((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                              in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    flags = (ImGuiInputTextFlags)((ulong)in_stack_fffffffffffffd78 >> 0x20);
    if (bVar3) {
      local_50 = &local_48;
      local_58 = std::array<polyscope::NavigateStyle,_5UL>::begin
                           ((array<polyscope::NavigateStyle,_5UL> *)0x3dfd95);
      local_60 = std::array<polyscope::NavigateStyle,_5UL>::end
                           ((array<polyscope::NavigateStyle,_5UL> *)0x3dfdaa);
      for (; flags = (ImGuiInputTextFlags)((ulong)in_stack_fffffffffffffd78 >> 0x20),
          local_58 != local_60; local_58 = local_58 + 1) {
        local_64 = *local_58;
        to_string_abi_cxx11_(in_stack_fffffffffffffdac);
        std::__cxx11::string::c_str();
        ImVec2::ImVec2(&local_90,0.0,0.0);
        bVar14 = ImGui::Selectable((char *)in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37
                                   ,in_stack_fffffffffffffe30,
                                   (ImVec2 *)
                                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        std::__cxx11::string::~string(local_88);
        if ((bVar14 & 1) != 0) {
          setNavigateStyle(CONCAT13(in_stack_fffffffffffffd57,
                                    CONCAT12(in_stack_fffffffffffffd56,in_stack_fffffffffffffd54)),
                           SUB41((uint)in_stack_fffffffffffffd50 >> 0x18,0));
          ImGui::SetItemDefaultFocus();
        }
      }
      ImGui::EndCombo();
    }
    ImGui::SameLine((float)CONCAT13(in_stack_fffffffffffffd57,
                                    CONCAT12(in_stack_fffffffffffffd56,in_stack_fffffffffffffd54)),
                    in_stack_fffffffffffffd50);
    ImGui::Text("Camera Style");
    ImGui::PushItemWidth((float)((ulong)in_stack_fffffffffffffd60 >> 0x20));
    std::__cxx11::string::string(local_b0);
    switch(view::upDir) {
    case 0:
      std::__cxx11::string::operator=(local_b0,"X Up");
      break;
    case 1:
      std::__cxx11::string::operator=(local_b0,"Y Up");
      break;
    case 2:
      std::__cxx11::string::operator=(local_b0,"Z Up");
      break;
    case 3:
      std::__cxx11::string::operator=(local_b0,"-X Up");
      break;
    case 4:
      std::__cxx11::string::operator=(local_b0,"-Y Up");
      break;
    case 5:
      std::__cxx11::string::operator=(local_b0,"-Z Up");
    }
    std::__cxx11::string::c_str();
    bVar3 = ImGui::BeginCombo((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                              in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    if (bVar3) {
      ImVec2::ImVec2(&local_b8,0.0,0.0);
      bVar3 = ImGui::Selectable((char *)in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37,
                                in_stack_fffffffffffffe30,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (bVar3) {
        setUpDir(XUp,false);
        ImGui::SetItemDefaultFocus();
      }
      ImVec2::ImVec2(&local_c0,0.0,0.0);
      bVar3 = ImGui::Selectable((char *)in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37,
                                in_stack_fffffffffffffe30,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (bVar3) {
        setUpDir(XUp,false);
        ImGui::SetItemDefaultFocus();
      }
      ImVec2::ImVec2(&local_c8,0.0,0.0);
      bVar3 = ImGui::Selectable((char *)in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37,
                                in_stack_fffffffffffffe30,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (bVar3) {
        setUpDir(XUp,false);
        ImGui::SetItemDefaultFocus();
      }
      ImVec2::ImVec2(&local_d0,0.0,0.0);
      bVar3 = ImGui::Selectable((char *)in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37,
                                in_stack_fffffffffffffe30,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (bVar3) {
        setUpDir(XUp,false);
        ImGui::SetItemDefaultFocus();
      }
      ImVec2::ImVec2(&local_d8,0.0,0.0);
      bVar3 = ImGui::Selectable((char *)in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37,
                                in_stack_fffffffffffffe30,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (bVar3) {
        setUpDir(XUp,false);
        ImGui::SetItemDefaultFocus();
      }
      ImVec2::ImVec2(&local_e0,0.0,0.0);
      bVar3 = ImGui::Selectable((char *)in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37,
                                in_stack_fffffffffffffe30,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (bVar3) {
        setUpDir(XUp,false);
        ImGui::SetItemDefaultFocus();
      }
      ImGui::EndCombo();
    }
    ImGui::SameLine((float)CONCAT13(in_stack_fffffffffffffd57,
                                    CONCAT12(in_stack_fffffffffffffd56,in_stack_fffffffffffffd54)),
                    in_stack_fffffffffffffd50);
    ImGui::Text("Up Direction");
    std::__cxx11::string::~string(local_b0);
    ImGui::PushItemWidth((float)((ulong)in_stack_fffffffffffffd60 >> 0x20));
    std::__cxx11::string::string(local_100);
    switch(view::frontDir) {
    case 0:
      std::__cxx11::string::operator=(local_100,"X Front");
      break;
    case 1:
      std::__cxx11::string::operator=(local_100,"Y Front");
      break;
    case 2:
      std::__cxx11::string::operator=(local_100,"Z Front");
      break;
    case 3:
      std::__cxx11::string::operator=(local_100,"-X Front");
      break;
    case 4:
      std::__cxx11::string::operator=(local_100,"-Y Front");
      break;
    case 5:
      std::__cxx11::string::operator=(local_100,"-Z Front");
    }
    std::__cxx11::string::c_str();
    bVar3 = ImGui::BeginCombo((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                              in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    if (bVar3) {
      ImVec2::ImVec2(&local_108,0.0,0.0);
      bVar3 = ImGui::Selectable((char *)in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37,
                                in_stack_fffffffffffffe30,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (bVar3) {
        setFrontDir(XFront,false);
        ImGui::SetItemDefaultFocus();
      }
      ImVec2::ImVec2(&local_110,0.0,0.0);
      bVar3 = ImGui::Selectable((char *)in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37,
                                in_stack_fffffffffffffe30,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (bVar3) {
        setFrontDir(XFront,false);
        ImGui::SetItemDefaultFocus();
      }
      ImVec2::ImVec2(&local_118,0.0,0.0);
      bVar3 = ImGui::Selectable((char *)in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37,
                                in_stack_fffffffffffffe30,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (bVar3) {
        setFrontDir(XFront,false);
        ImGui::SetItemDefaultFocus();
      }
      ImVec2::ImVec2(&local_120,0.0,0.0);
      bVar3 = ImGui::Selectable((char *)in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37,
                                in_stack_fffffffffffffe30,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (bVar3) {
        setFrontDir(XFront,false);
        ImGui::SetItemDefaultFocus();
      }
      ImVec2::ImVec2(&local_128,0.0,0.0);
      bVar3 = ImGui::Selectable((char *)in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37,
                                in_stack_fffffffffffffe30,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (bVar3) {
        setFrontDir(XFront,false);
        ImGui::SetItemDefaultFocus();
      }
      ImVec2::ImVec2(&local_130,0.0,0.0);
      bVar3 = ImGui::Selectable((char *)in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37,
                                in_stack_fffffffffffffe30,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (bVar3) {
        setFrontDir(XFront,false);
        ImGui::SetItemDefaultFocus();
      }
      ImGui::EndCombo();
    }
    ImGui::SameLine((float)CONCAT13(in_stack_fffffffffffffd57,
                                    CONCAT12(in_stack_fffffffffffffd56,in_stack_fffffffffffffd54)),
                    in_stack_fffffffffffffd50);
    ImGui::Text("Front Direction");
    std::__cxx11::string::~string(local_100);
    uVar10 = extraout_XMM0_Qb;
    vVar13 = getUpVec();
    uVar11 = 0;
    auVar2._8_8_ = uVar10;
    auVar2._0_8_ = vVar13._0_8_;
    vmovlpd_avx(auVar2);
    vVar13 = getFrontVec();
    aVar12 = vVar13.field_2;
    auVar1._8_8_ = uVar11;
    auVar1._0_8_ = vVar13._0_8_;
    preview_value = (char *)vmovlpd_avx(auVar1);
    fVar8 = glm::dot<3,float,(glm::qualifier)0>
                      ((vec<3,_float,_(glm::qualifier)0> *)
                       CONCAT17(in_stack_fffffffffffffd57,
                                CONCAT16(in_stack_fffffffffffffd56,
                                         CONCAT24(in_stack_fffffffffffffd54,
                                                  in_stack_fffffffffffffd50))),
                       in_stack_fffffffffffffd48);
    dVar9 = std::fabs((double)(ulong)(uint)fVar8);
    if (0.01 < SUB84(dVar9,0)) {
      ImGui::TextUnformatted
                ((char *)CONCAT17(in_stack_fffffffffffffd57,
                                  CONCAT16(in_stack_fffffffffffffd56,
                                           CONCAT24(in_stack_fffffffffffffd54,
                                                    in_stack_fffffffffffffd50))),
                 (char *)in_stack_fffffffffffffd48);
    }
    fVar8 = (float)moveScale;
    ImGui::SliderFloat((char *)CONCAT17(in_stack_fffffffffffffd77,
                                        CONCAT16(in_stack_fffffffffffffd76,
                                                 CONCAT15(in_stack_fffffffffffffd75,
                                                          CONCAT14(in_stack_fffffffffffffd74,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffd73,
                                                  CONCAT12(in_stack_fffffffffffffd72,
                                                           CONCAT11(in_stack_fffffffffffffd71,
                                                                    in_stack_fffffffffffffd70)))))))
                       ,(float *)CONCAT17(in_stack_fffffffffffffd6f,
                                          CONCAT16(in_stack_fffffffffffffd6e,
                                                   CONCAT15(in_stack_fffffffffffffd6d,
                                                            CONCAT14(in_stack_fffffffffffffd6c,
                                                                     in_stack_fffffffffffffd68)))),
                       (float)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                       SUB84(in_stack_fffffffffffffd60,0),in_stack_fffffffffffffd58,
                       CONCAT13(in_stack_fffffffffffffd57,
                                CONCAT12(in_stack_fffffffffffffd56,in_stack_fffffffffffffd54)));
    moveScale = (double)fVar8;
    bVar3 = ImGui::TreeNode((char *)in_stack_fffffffffffffd48);
    if (bVar3) {
      bVar3 = ImGui::Checkbox((char *)CONCAT44(fVar8,in_stack_fffffffffffffe88),
                              in_stack_fffffffffffffe80);
      if (bVar3) {
        updateStructureExtents();
      }
      if ((options::automaticallyComputeSceneExtents & 1) == 0) {
        if ((buildViewGui::lengthScaleUpper == -777.0) && (!NAN(buildViewGui::lengthScaleUpper))) {
          buildViewGui::lengthScaleUpper = polyscope::state::lengthScale * 2.0;
        }
        bVar3 = ImGui::SliderFloat((char *)CONCAT17(in_stack_fffffffffffffd77,
                                                    CONCAT16(in_stack_fffffffffffffd76,
                                                             CONCAT15(in_stack_fffffffffffffd75,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffd74,
                                                  CONCAT13(in_stack_fffffffffffffd73,
                                                           CONCAT12(in_stack_fffffffffffffd72,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70))))))),
                                   (float *)CONCAT17(in_stack_fffffffffffffd6f,
                                                     CONCAT16(in_stack_fffffffffffffd6e,
                                                              CONCAT15(in_stack_fffffffffffffd6d,
                                                                       CONCAT14(
                                                  in_stack_fffffffffffffd6c,
                                                  in_stack_fffffffffffffd68)))),
                                   (float)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                                   SUB84(in_stack_fffffffffffffd60,0),in_stack_fffffffffffffd58,
                                   CONCAT13(in_stack_fffffffffffffd57,
                                            CONCAT12(in_stack_fffffffffffffd56,
                                                     in_stack_fffffffffffffd54)));
        if (bVar3) {
          requestRedraw();
        }
        bVar3 = ImGui::IsItemDeactivatedAfterEdit();
        if (bVar3) {
          in_stack_fffffffffffffd90 =
               (char *)std::fmax<double,float>
                                 ((double)polyscope::state::lengthScale +
                                  (double)polyscope::state::lengthScale,
                                  buildViewGui::lengthScaleUpper);
          buildViewGui::lengthScaleUpper = (float)(double)in_stack_fffffffffffffd90;
        }
        ImGui::TextUnformatted
                  ((char *)CONCAT17(in_stack_fffffffffffffd57,
                                    CONCAT16(in_stack_fffffffffffffd56,
                                             CONCAT24(in_stack_fffffffffffffd54,
                                                      in_stack_fffffffffffffd50))),
                   (char *)in_stack_fffffffffffffd48);
        ImGui::PushItemWidth((float)((ulong)in_stack_fffffffffffffd60 >> 0x20));
        in_stack_fffffffffffffe80 = (bool *)(polyscope::state::boundingBox + 0xc);
        local_188 = polyscope::state::boundingBox;
        in_stack_fffffffffffffd88 =
             glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                       ((vec<3,_float,_(glm::qualifier)0> *)(polyscope::state::boundingBox + 0xc),0)
        ;
        bVar3 = ImGui::InputFloat3((char *)CONCAT17(in_stack_fffffffffffffd77,
                                                    CONCAT16(in_stack_fffffffffffffd76,
                                                             CONCAT15(in_stack_fffffffffffffd75,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffd74,
                                                  CONCAT13(in_stack_fffffffffffffd73,
                                                           CONCAT12(in_stack_fffffffffffffd72,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70))))))),
                                   (float *)CONCAT17(in_stack_fffffffffffffd6f,
                                                     CONCAT16(in_stack_fffffffffffffd6e,
                                                              CONCAT15(in_stack_fffffffffffffd6d,
                                                                       CONCAT14(
                                                  in_stack_fffffffffffffd6c,
                                                  in_stack_fffffffffffffd68)))),
                                   in_stack_fffffffffffffd60,
                                   (ImGuiInputTextFlags)((ulong)in_stack_fffffffffffffd58 >> 0x20));
        in_stack_fffffffffffffd84 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffd84);
        if (bVar3) {
          updateStructureExtents();
        }
        pfVar7 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                           ((vec<3,_float,_(glm::qualifier)0> *)polyscope::state::boundingBox,0);
        flags = (ImGuiInputTextFlags)((ulong)pfVar7 >> 0x20);
        in_stack_fffffffffffffd77 =
             ImGui::InputFloat3((char *)CONCAT17(in_stack_fffffffffffffd77,
                                                 CONCAT16(in_stack_fffffffffffffd76,
                                                          CONCAT15(in_stack_fffffffffffffd75,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffd74,
                                                  CONCAT13(in_stack_fffffffffffffd73,
                                                           CONCAT12(in_stack_fffffffffffffd72,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70))))))),
                                (float *)CONCAT17(in_stack_fffffffffffffd6f,
                                                  CONCAT16(in_stack_fffffffffffffd6e,
                                                           CONCAT15(in_stack_fffffffffffffd6d,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffd6c,
                                                  in_stack_fffffffffffffd68)))),
                                in_stack_fffffffffffffd60,
                                (ImGuiInputTextFlags)((ulong)in_stack_fffffffffffffd58 >> 0x20));
        if ((bool)in_stack_fffffffffffffd77) {
          updateStructureExtents();
        }
        ImGui::PopItemWidth();
      }
      ImGui::TreePop();
    }
    ImGui::SetNextTreeNodeOpen(false,0x3e0b70);
    uVar4 = ImGui::TreeNode((char *)in_stack_fffffffffffffd48);
    if ((bool)uVar4) {
      local_18c = (float)fov;
      uVar5 = ImGui::SliderFloat((char *)CONCAT17(in_stack_fffffffffffffd77,
                                                  CONCAT16(uVar4,CONCAT15(in_stack_fffffffffffffd75,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffd74,
                                                  CONCAT13(in_stack_fffffffffffffd73,
                                                           CONCAT12(in_stack_fffffffffffffd72,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70))))))),
                                 (float *)CONCAT17(in_stack_fffffffffffffd6f,
                                                   CONCAT16(in_stack_fffffffffffffd6e,
                                                            CONCAT15(in_stack_fffffffffffffd6d,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffd6c,
                                                  in_stack_fffffffffffffd68)))),
                                 (float)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                                 SUB84(in_stack_fffffffffffffd60,0),in_stack_fffffffffffffd58,
                                 CONCAT13(in_stack_fffffffffffffd57,
                                          CONCAT12(in_stack_fffffffffffffd56,
                                                   in_stack_fffffffffffffd54)));
      if ((bool)uVar5) {
        fov = (double)local_18c;
        requestRedraw();
      }
      local_190 = (float)nearClipRatio;
      local_194 = (float)farClipRatio;
      uVar6 = ImGui::SliderFloat((char *)CONCAT17(in_stack_fffffffffffffd77,
                                                  CONCAT16(uVar4,CONCAT15(uVar5,CONCAT14(
                                                  in_stack_fffffffffffffd74,
                                                  CONCAT13(in_stack_fffffffffffffd73,
                                                           CONCAT12(in_stack_fffffffffffffd72,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70))))))),
                                 (float *)CONCAT17(in_stack_fffffffffffffd6f,
                                                   CONCAT16(in_stack_fffffffffffffd6e,
                                                            CONCAT15(in_stack_fffffffffffffd6d,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffd6c,
                                                  in_stack_fffffffffffffd68)))),
                                 (float)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                                 SUB84(in_stack_fffffffffffffd60,0),in_stack_fffffffffffffd58,
                                 CONCAT13(in_stack_fffffffffffffd57,
                                          CONCAT12(in_stack_fffffffffffffd56,
                                                   in_stack_fffffffffffffd54)));
      if ((bool)uVar6) {
        nearClipRatio = (double)local_190;
        requestRedraw();
      }
      bVar3 = ImGui::SliderFloat((char *)CONCAT17(in_stack_fffffffffffffd77,
                                                  CONCAT16(uVar4,CONCAT15(uVar5,CONCAT14(uVar6,
                                                  CONCAT13(in_stack_fffffffffffffd73,
                                                           CONCAT12(in_stack_fffffffffffffd72,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70))))))),
                                 (float *)CONCAT17(in_stack_fffffffffffffd6f,
                                                   CONCAT16(in_stack_fffffffffffffd6e,
                                                            CONCAT15(in_stack_fffffffffffffd6d,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffd6c,
                                                  in_stack_fffffffffffffd68)))),
                                 (float)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                                 SUB84(in_stack_fffffffffffffd60,0),in_stack_fffffffffffffd58,
                                 CONCAT13(in_stack_fffffffffffffd57,
                                          CONCAT12(in_stack_fffffffffffffd56,
                                                   in_stack_fffffffffffffd54)));
      if (bVar3) {
        farClipRatio = (double)local_194;
        requestRedraw();
      }
      to_string_abi_cxx11_((ProjectionMode)((ulong)in_stack_fffffffffffffd88 >> 0x20));
      std::__cxx11::string::c_str();
      bVar3 = ImGui::BeginCombo((char *)CONCAT44(in_stack_fffffffffffffeac,aVar12),preview_value,
                                in_stack_fffffffffffffe9c);
      if (bVar3) {
        ImVec2::ImVec2(&local_1c0,0.0,0.0);
        bVar3 = ImGui::Selectable((char *)in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37,
                                  in_stack_fffffffffffffe30,
                                  (ImVec2 *)
                                  CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        if (bVar3) {
          projectionMode = 0;
          requestRedraw();
          ImGui::SetItemDefaultFocus();
        }
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffe38,0.0,0.0);
        bVar3 = ImGui::Selectable((char *)in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37,
                                  in_stack_fffffffffffffe30,
                                  (ImVec2 *)
                                  CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        if (bVar3) {
          projectionMode = 1;
          requestRedraw();
          ImGui::SetItemDefaultFocus();
        }
        ImGui::EndCombo();
      }
      ImGui::SameLine((float)CONCAT13(in_stack_fffffffffffffd57,
                                      CONCAT12(in_stack_fffffffffffffd56,in_stack_fffffffffffffd54))
                      ,in_stack_fffffffffffffd50);
      ImGui::Text("Projection");
      ImGui::TreePop();
      std::__cxx11::string::~string(local_1b8);
    }
    item_width = (float)((ulong)in_stack_fffffffffffffd60 >> 0x20);
    bVar3 = ImGui::TreeNode((char *)in_stack_fffffffffffffd48);
    if (bVar3) {
      ImGui::TextUnformatted
                ((char *)CONCAT17(in_stack_fffffffffffffd57,
                                  CONCAT16(in_stack_fffffffffffffd56,
                                           CONCAT24(in_stack_fffffffffffffd54,
                                                    in_stack_fffffffffffffd50))),
                 (char *)in_stack_fffffffffffffd48);
      ImGui::SameLine((float)CONCAT13(in_stack_fffffffffffffd57,
                                      CONCAT12(in_stack_fffffffffffffd56,in_stack_fffffffffffffd54))
                      ,in_stack_fffffffffffffd50);
      ImGui::PushItemWidth(item_width);
      bVar14 = 0;
      ImGui::InputInt(in_stack_fffffffffffffd90,(int *)in_stack_fffffffffffffd88,
                      in_stack_fffffffffffffd84,in_stack_fffffffffffffd80,flags);
      bVar3 = ImGui::IsItemDeactivatedAfterEdit();
      bVar14 = bVar14 & 1 | bVar3;
      ImGui::SameLine((float)CONCAT13(in_stack_fffffffffffffd57,
                                      CONCAT12(in_stack_fffffffffffffd56,in_stack_fffffffffffffd54))
                      ,in_stack_fffffffffffffd50);
      ImGui::InputInt(in_stack_fffffffffffffd90,(int *)in_stack_fffffffffffffd88,
                      in_stack_fffffffffffffd84,in_stack_fffffffffffffd80,flags);
      bVar3 = ImGui::IsItemDeactivatedAfterEdit();
      if ((bVar14 & 1) != 0 || bVar3) {
        std::max<int>((int *)&stack0xfffffffffffffe30,(int *)&stack0xfffffffffffffe28);
        local_1dc = 0x20;
        std::max<int>((int *)&stack0xfffffffffffffe2c,&local_1dc);
        setWindowSize(0,0x3e103e);
      }
      ImGui::PopItemWidth();
      ImGui::SameLine((float)CONCAT13(in_stack_fffffffffffffd57,
                                      CONCAT12(in_stack_fffffffffffffd56,in_stack_fffffffffffffd54))
                      ,in_stack_fffffffffffffd50);
      getWindowResizable();
      bVar3 = ImGui::Checkbox((char *)CONCAT44(fVar8,in_stack_fffffffffffffe88),
                              in_stack_fffffffffffffe80);
      if (bVar3) {
        setWindowResizable(false);
      }
      ImGui::TreePop();
    }
    buildSlicePlaneGUI();
    ImGui::PopItemWidth();
    ImGui::TreePop();
    std::__cxx11::string::~string(local_20);
  }
  return;
}

Assistant:

void buildViewGui() {

  ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
  if (openSlicePlaneMenu) {
    // need to recursively open this tree node to respect slice plane menu open flag
    ImGui::SetNextTreeNodeOpen(true);
  }
  if (ImGui::TreeNode("View")) {

    // == Camera style

    std::string viewStyleName = to_string(view::style);

    ImGui::PushItemWidth(120);
    std::array<NavigateStyle, 5> styles{NavigateStyle::Turntable, NavigateStyle::Free, NavigateStyle::Planar,
                                        NavigateStyle::None, NavigateStyle::FirstPerson};
    if (ImGui::BeginCombo("##View Style", viewStyleName.c_str())) {

      for (NavigateStyle s : styles) {
        if (ImGui::Selectable(to_string(s).c_str(), view::style == s)) {
          setNavigateStyle(s, true);
          ImGui::SetItemDefaultFocus();
        }
      }

      ImGui::EndCombo();
    }
    ImGui::SameLine();

    ImGui::Text("Camera Style");

    { // == Up direction
      ImGui::PushItemWidth(120);
      std::string upStyleName;
      switch (upDir) {
      case UpDir::XUp:
        upStyleName = "X Up";
        break;
      case UpDir::NegXUp:
        upStyleName = "-X Up";
        break;
      case UpDir::YUp:
        upStyleName = "Y Up";
        break;
      case UpDir::NegYUp:
        upStyleName = "-Y Up";
        break;
      case UpDir::ZUp:
        upStyleName = "Z Up";
        break;
      case UpDir::NegZUp:
        upStyleName = "-Z Up";
        break;
      }

      if (ImGui::BeginCombo("##Up Direction", upStyleName.c_str())) {
        if (ImGui::Selectable("X Up", view::upDir == view::UpDir::XUp)) {
          view::setUpDir(view::UpDir::XUp, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("-X Up", view::upDir == view::UpDir::NegXUp)) {
          view::setUpDir(view::UpDir::NegXUp, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("Y Up", view::upDir == view::UpDir::YUp)) {
          view::setUpDir(view::UpDir::YUp, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("-Y Up", view::upDir == view::UpDir::NegYUp)) {
          view::setUpDir(view::UpDir::NegYUp, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("Z Up", view::upDir == view::UpDir::ZUp)) {
          view::setUpDir(view::UpDir::ZUp, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("-Z Up", view::upDir == view::UpDir::NegZUp)) {
          view::setUpDir(view::UpDir::NegZUp, true);
          ImGui::SetItemDefaultFocus();
        }
        ImGui::EndCombo();
      }
      ImGui::SameLine();
      ImGui::Text("Up Direction");
    }

    { // == Front direction
      ImGui::PushItemWidth(120);
      std::string frontStyleName;
      switch (frontDir) {
      case FrontDir::XFront:
        frontStyleName = "X Front";
        break;
      case FrontDir::NegXFront:
        frontStyleName = "-X Front";
        break;
      case FrontDir::YFront:
        frontStyleName = "Y Front";
        break;
      case FrontDir::NegYFront:
        frontStyleName = "-Y Front";
        break;
      case FrontDir::ZFront:
        frontStyleName = "Z Front";
        break;
      case FrontDir::NegZFront:
        frontStyleName = "-Z Front";
        break;
      }

      if (ImGui::BeginCombo("##Front Direction", frontStyleName.c_str())) {
        if (ImGui::Selectable("X Front", view::frontDir == FrontDir::XFront)) {
          view::setFrontDir(FrontDir::XFront, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("-X Front", view::frontDir == FrontDir::NegXFront)) {
          view::setFrontDir(FrontDir::NegXFront, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("Y Front", view::frontDir == FrontDir::YFront)) {
          view::setFrontDir(FrontDir::YFront, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("-Y Front", view::frontDir == FrontDir::NegYFront)) {
          view::setFrontDir(FrontDir::NegYFront, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("Z Front", view::frontDir == FrontDir::ZFront)) {
          view::setFrontDir(FrontDir::ZFront, true);
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("-Z Front", view::frontDir == FrontDir::NegZFront)) {
          view::setFrontDir(FrontDir::NegZFront, true);
          ImGui::SetItemDefaultFocus();
        }
        ImGui::EndCombo();
      }
      ImGui::SameLine();
      ImGui::Text("Front Direction");
    }

    {
      // Show a warning if up and front are co-linear
      glm::vec3 upDir = getUpVec();
      glm::vec3 frontDir = getFrontVec();
      if (std::fabs(glm::dot(upDir, frontDir)) > 0.01) {
        ImGui::TextUnformatted("WARNING: Up and Front directions\nare degenerate.");
      }
    }

    // Move speed
    float moveScaleF = view::moveScale;
    ImGui::SliderFloat(" Move Speed", &moveScaleF, 0.0, 2.0, "%.5f",
                       ImGuiSliderFlags_Logarithmic | ImGuiSliderFlags_NoRoundToFormat);
    view::moveScale = moveScaleF;


    if (ImGui::TreeNode("Scene Extents")) {

      if (ImGui::Checkbox("Set automatically", &options::automaticallyComputeSceneExtents)) {
        updateStructureExtents();
      }

      if (!options::automaticallyComputeSceneExtents) {

        static float lengthScaleUpper = -777;
        if (lengthScaleUpper == -777) lengthScaleUpper = 2. * state::lengthScale;
        if (ImGui::SliderFloat("Length Scale", &state::lengthScale, 0, lengthScaleUpper, "%.5f")) {
          requestRedraw();
        }
        if (ImGui::IsItemDeactivatedAfterEdit()) {
          // the upper bound for the slider is dynamically adjust to be a bit bigger than the lower bound, but only
          // does so on release of the widget (so it doesn't scaleo off to infinity), and only ever gets larger (so
          // you don't get stuck at 0)
          lengthScaleUpper = std::fmax(2. * state::lengthScale, lengthScaleUpper);
        }


        ImGui::TextUnformatted("Bounding Box:");
        ImGui::PushItemWidth(200);
        glm::vec3& bboxMin = std::get<0>(state::boundingBox);
        glm::vec3& bboxMax = std::get<1>(state::boundingBox);
        if (ImGui::InputFloat3("min", &bboxMin[0])) updateStructureExtents();
        if (ImGui::InputFloat3("max", &bboxMax[0])) updateStructureExtents();
        ImGui::PopItemWidth();
      }


      ImGui::TreePop();
    }


    ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
    if (ImGui::TreeNode("Camera Parameters")) {

      // Field of view
      float fovF = fov;
      if (ImGui::SliderFloat(" Field of View", &fovF, minFov, maxFov, "%.2f deg")) {
        fov = fovF;
        requestRedraw();
      };

      // Clip planes
      float nearClipRatioF = nearClipRatio;
      float farClipRatioF = farClipRatio;
      if (ImGui::SliderFloat(" Clip Near", &nearClipRatioF, 0., 10., "%.5f",
                             ImGuiSliderFlags_Logarithmic | ImGuiSliderFlags_NoRoundToFormat)) {
        nearClipRatio = nearClipRatioF;
        requestRedraw();
      }
      if (ImGui::SliderFloat(" Clip Far", &farClipRatioF, 1., 1000., "%.2f",
                             ImGuiSliderFlags_Logarithmic | ImGuiSliderFlags_NoRoundToFormat)) {
        farClipRatio = farClipRatioF;
        requestRedraw();
      }


      std::string projectionModeStr = to_string(view::projectionMode);
      if (ImGui::BeginCombo("##ProjectionMode", projectionModeStr.c_str())) {
        if (ImGui::Selectable("Perspective", view::projectionMode == ProjectionMode::Perspective)) {
          view::projectionMode = ProjectionMode::Perspective;
          requestRedraw();
          ImGui::SetItemDefaultFocus();
        }
        if (ImGui::Selectable("Orthographic", view::projectionMode == ProjectionMode::Orthographic)) {
          view::projectionMode = ProjectionMode::Orthographic;
          requestRedraw();
          ImGui::SetItemDefaultFocus();
        }
        ImGui::EndCombo();
      }
      ImGui::SameLine();
      ImGui::Text("Projection");


      ImGui::TreePop();
    }

    if (ImGui::TreeNode("Window")) {

      {
        ImGui::TextUnformatted("Dim:");
        ImGui::SameLine();
        ImGui::PushItemWidth(50);
        bool changed = false;
        int currWidth = view::windowWidth;
        int currHeight = view::windowHeight;
        ImGui::InputInt("##width", &currWidth, 0);
        changed |= ImGui::IsItemDeactivatedAfterEdit();
        ImGui::SameLine();
        ImGui::InputInt("##height", &currHeight, 0);
        changed |= ImGui::IsItemDeactivatedAfterEdit();
        if (changed) {
          // make sure it's at least 32 pixels, anything less is surely a mistake and might break things
          currWidth = std::max(currWidth, 32);
          currHeight = std::max(currHeight, 32);
          view::setWindowSize(currWidth, currHeight);
        }
        ImGui::PopItemWidth();
      }

      {
        ImGui::SameLine();
        bool sizeLocked = !getWindowResizable();
        bool changed = ImGui::Checkbox("lock", &sizeLocked);
        if (changed) {
          setWindowResizable(!sizeLocked);
        }
      }


      ImGui::TreePop();
    }

    buildSlicePlaneGUI();

    ImGui::PopItemWidth();
    ImGui::TreePop();
  }
}